

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

bool __thiscall
slang::ast::Expression::bindMembershipExpressions
          (Expression *this,ASTContext *context,TokenKind keyword,bool requireIntegral,
          bool unwrapUnpacked,bool allowTypeReferences,bool allowOpenRange,
          ExpressionSyntax *valueExpr,
          span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions,
          SmallVectorBase<const_slang::ast::Expression_*> *results)

{
  long lVar1;
  SyntaxNode *pSVar2;
  bool bVar3;
  Compilation *compilation;
  Expression *pEVar4;
  Type *pTVar5;
  OpenRangeExpression *pOVar6;
  Diagnostic *pDVar7;
  reference ppEVar8;
  undefined7 in_register_00000009;
  undefined6 in_register_00000012;
  bitmask<slang::ast::ASTFlags> bVar9;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  long lVar10;
  size_type index;
  string_view sVar11;
  bool bad;
  bool canBeStrings;
  undefined7 in_stack_00000009;
  anon_class_48_6_7cdd41da checkType;
  bool local_94;
  bool local_93;
  TokenKind local_92;
  Expression *local_90;
  Type *local_88;
  underlying_type local_80;
  undefined4 local_74;
  int local_70;
  undefined4 local_6c;
  ASTContext *local_68;
  anon_class_48_6_7cdd41da local_60;
  
  local_6c = CONCAT31(in_register_00000089,allowTypeReferences);
  local_74 = (undefined4)CONCAT71(in_register_00000009,requireIntegral);
  local_92 = (TokenKind)context;
  bVar9.m_bits._0_4_ = (int)CONCAT71(in_register_00000081,unwrapUnpacked) << 0x11;
  bVar9.m_bits._4_4_ = 0;
  compilation = ASTContext::getCompilation((ASTContext *)this);
  local_80 = bVar9.m_bits;
  pEVar4 = create(compilation,(ExpressionSyntax *)CONCAT71(in_stack_00000009,allowOpenRange),
                  (ASTContext *)this,bVar9,(Type *)0x0);
  local_60.type = (Type **)pEVar4;
  SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
            ((SmallVectorBase<slang::ast::Expression_const*> *)expressions.size_,
             (Expression **)&local_60);
  pTVar5 = not_null<const_slang::ast::Type_*>::get(&pEVar4->type);
  local_88 = pTVar5;
  local_94 = Expression::bad(pEVar4);
  local_93 = isImplicitString(pEVar4);
  local_70 = (int)CONCAT62(in_register_00000012,keyword);
  if (local_70 == 0) {
    bVar3 = Type::isAggregate(pTVar5);
    if (!bVar3) goto LAB_0031bbae;
  }
  else {
    bVar3 = Type::isIntegral(pTVar5);
    if (bVar3) goto LAB_0031bbae;
  }
  if (local_94 == false) {
    pDVar7 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x260007,pEVar4->sourceRange);
    pDVar7 = ast::operator<<(pDVar7,local_88);
    sVar11 = parsing::LexerFacts::getTokenKindText(local_92);
    Diagnostic::operator<<(pDVar7,sVar11);
    local_94 = true;
  }
LAB_0031bbae:
  local_60.type = &local_88;
  local_60.canBeStrings = &local_93;
  local_60.keyword = &local_92;
  local_60.bad = &local_94;
  pSVar2 = &valueExpr->super_SyntaxNode;
  bVar9.m_bits = local_80;
  local_68 = (ASTContext *)this;
  local_60.comp = compilation;
  local_60.context = (ASTContext *)this;
  for (; valueExpr != (ExpressionSyntax *)(&pSVar2->parent + (long)expressions.data_);
      valueExpr = (ExpressionSyntax *)((long)valueExpr + 8)) {
    local_90 = create(compilation,*(ExpressionSyntax **)valueExpr,(ASTContext *)this,bVar9,
                      (Type *)0x0);
    SmallVectorBase<slang::ast::Expression_const*>::
    emplace_back<slang::ast::Expression_const*const&>
              ((SmallVectorBase<slang::ast::Expression_const*> *)expressions.size_,&local_90);
    bVar3 = Expression::bad(local_90);
    local_94 = (bool)(bVar3 | local_94);
    if (local_94 == false) {
      if (((char)local_6c == '\0') || (local_90->kind != OpenRange)) {
        pTVar5 = not_null<const_slang::ast::Type_*>::get(&local_90->type);
        if ((char)local_70 == '\0') {
          if ((char)local_74 != '\0') {
            while (bVar3 = Type::isUnpackedArray(pTVar5), bVar3) {
              pTVar5 = Type::getArrayElementType(pTVar5);
            }
          }
          if (((local_93 == true) && (bVar3 = isImplicitString(local_90), !bVar3)) &&
             (bVar3 = Type::isString(pTVar5), !bVar3)) {
            local_93 = false;
          }
          bindMembershipExpressions::anon_class_48_6_7cdd41da::operator()(&local_60,local_90,pTVar5)
          ;
          bVar9.m_bits = local_80;
        }
        else {
          bVar3 = Type::isIntegral(pTVar5);
          if (bVar3) {
            local_88 = binaryOperatorType(compilation,local_88,pTVar5,false,false);
            bVar9.m_bits = local_80;
          }
          else {
            pDVar7 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x260007,local_90->sourceRange
                                        );
            pDVar7 = ast::operator<<(pDVar7,pTVar5);
            sVar11 = parsing::LexerFacts::getTokenKindText(local_92);
            Diagnostic::operator<<(pDVar7,sVar11);
            local_94 = true;
            bVar9.m_bits = local_80;
          }
        }
      }
      else {
        if ((local_93 == true) && (bVar3 = isImplicitString(local_90), !bVar3)) {
          local_93 = false;
        }
        pOVar6 = as<slang::ast::OpenRangeExpression>(local_90);
        pEVar4 = pOVar6->left_;
        pTVar5 = not_null<const_slang::ast::Type_*>::get(&pEVar4->type);
        bindMembershipExpressions::anon_class_48_6_7cdd41da::operator()(&local_60,pEVar4,pTVar5);
        pEVar4 = pOVar6->right_;
        pTVar5 = not_null<const_slang::ast::Type_*>::get(&pEVar4->type);
        bindMembershipExpressions::anon_class_48_6_7cdd41da::operator()(&local_60,pEVar4,pTVar5);
        this = (Expression *)local_68;
        bVar9.m_bits = local_80;
      }
    }
  }
  if (local_94 == false) {
    lVar1 = *(long *)expressions.size_;
    index = 0;
    for (lVar10 = *(long *)(expressions.size_ + 8) << 3; lVar10 != 0; lVar10 = lVar10 + -8) {
      local_90 = *(Expression **)(lVar1 + index * 8);
      bVar3 = Type::isNumeric(local_88);
      if ((bVar3) || (bVar3 = Type::isString(local_88), bVar3)) {
        pTVar5 = not_null<const_slang::ast::Type_*>::get(&local_90->type);
        bVar3 = Type::isUnpackedArray(pTVar5);
        if (bVar3) goto LAB_0031be2e;
        contextDetermined((ASTContext *)this,&local_90,local_88,(SourceLocation)0x0);
      }
      else {
LAB_0031be2e:
        selfDetermined((ASTContext *)this,&local_90);
      }
      bVar3 = Expression::bad(local_90);
      pEVar4 = local_90;
      if (bVar3) goto LAB_0031bdce;
      ppEVar8 = SmallVectorBase<const_slang::ast::Expression_*>::operator[]
                          ((SmallVectorBase<const_slang::ast::Expression_*> *)expressions.size_,
                           index);
      *ppEVar8 = pEVar4;
      index = index + 1;
    }
    bVar3 = true;
  }
  else {
LAB_0031bdce:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Expression::bindMembershipExpressions(const ASTContext& context, TokenKind keyword,
                                           bool requireIntegral, bool unwrapUnpacked,
                                           bool allowTypeReferences, bool allowOpenRange,
                                           const ExpressionSyntax& valueExpr,
                                           span<const ExpressionSyntax* const> expressions,
                                           SmallVectorBase<const Expression*>& results) {
    auto extraFlags = allowTypeReferences ? ASTFlags::AllowTypeReferences : ASTFlags::None;
    Compilation& comp = context.getCompilation();
    Expression& valueRes = create(comp, valueExpr, context, extraFlags);
    results.push_back(&valueRes);

    const Type* type = valueRes.type;
    bool bad = valueRes.bad();
    bool canBeStrings = valueRes.isImplicitString();

    if ((!requireIntegral && type->isAggregate()) || (requireIntegral && !type->isIntegral())) {
        if (!bad) {
            context.addDiag(diag::BadSetMembershipType, valueRes.sourceRange)
                << *type << LexerFacts::getTokenKindText(keyword);
            bad = true;
        }
    }

    auto checkType = [&](const Expression& expr, const Type& bt) {
        if (bt.isNumeric() && type->isNumeric()) {
            type = binaryOperatorType(comp, type, &bt, false);
        }
        else if ((bt.isClass() && bt.isAssignmentCompatible(*type)) ||
                 (type->isClass() && type->isAssignmentCompatible(bt))) {
            // ok
        }
        else if ((bt.isCHandle() || bt.isNull()) && (type->isCHandle() || type->isNull())) {
            // ok
        }
        else if ((bt.isEvent() || bt.isNull()) && (type->isEvent() || type->isNull())) {
            // ok
        }
        else if ((bt.isCovergroup() || bt.isNull()) && (type->isCovergroup() || type->isNull())) {
            // ok
        }
        else if (bt.isTypeRefType() && type->isTypeRefType()) {
            // ok
        }
        else if (canBeStrings) {
            // If canBeStrings is still true, it means either this specific type or
            // the common type (or both) are of type string. This is ok, but force
            // all further expressions to also be strings (or implicitly
            // convertible to them).
            type = &comp.getStringType();
        }
        else if (bt.isAggregate()) {
            // Aggregates are just never allowed in membership expressions.
            context.addDiag(diag::BadSetMembershipType, expr.sourceRange)
                << bt << LexerFacts::getTokenKindText(keyword);
            bad = true;
        }
        else {
            // Couldn't find a common type.
            context.addDiag(diag::NoCommonComparisonType, expr.sourceRange)
                << LexerFacts::getTokenKindText(keyword) << bt << *type;
            bad = true;
        }
    };

    // We need to find a common type across all expressions. If this is for a wildcard
    // case statement, the types can only be integral. Otherwise all singular types are allowed.
    for (auto expr : expressions) {
        Expression* bound = &create(comp, *expr, context, extraFlags);
        results.push_back(bound);
        bad |= bound->bad();
        if (bad)
            continue;

        // Special handling for open range expressions -- they don't have
        // a real type on their own, we need to check their bounds.
        if (allowOpenRange && bound->kind == ExpressionKind::OpenRange) {
            if (canBeStrings && !bound->isImplicitString())
                canBeStrings = false;

            auto& range = bound->as<OpenRangeExpression>();
            checkType(range.left(), *range.left().type);
            checkType(range.right(), *range.right().type);
            continue;
        }

        const Type* bt = bound->type;
        if (requireIntegral) {
            if (!bt->isIntegral()) {
                context.addDiag(diag::BadSetMembershipType, bound->sourceRange)
                    << *bt << LexerFacts::getTokenKindText(keyword);
                bad = true;
            }
            else {
                type = binaryOperatorType(comp, type, bt, false);
            }
            continue;
        }

        // If this is an "inside" operation, then unpacked arrays are unwrapped
        // into their element types before checking further.
        if (unwrapUnpacked) {
            while (bt->isUnpackedArray())
                bt = bt->getArrayElementType();
        }

        if (canBeStrings && !bound->isImplicitString() && !bt->isString())
            canBeStrings = false;

        checkType(*bound, *bt);
    }

    if (bad)
        return false;

    size_t index = 0;
    for (auto result : results) {
        // const_casts here are because we want the result array to be constant and
        // don't want to waste time / space allocating another array here locally just
        // to immediately copy it to the output.
        Expression* expr = const_cast<Expression*>(result);

        if ((type->isNumeric() || type->isString()) && !expr->type->isUnpackedArray())
            contextDetermined(context, expr, *type);
        else
            selfDetermined(context, expr);

        if (expr->bad())
            return false;

        results[index++] = expr;
    }

    return true;
}